

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5BufferCompare(Fts5Buffer *pLeft,Fts5Buffer *pRight)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = pLeft->n;
  uVar2 = pRight->n;
  uVar3 = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    uVar3 = uVar1;
  }
  if ((0 < (int)uVar3) && (iVar4 = memcmp(pLeft->p,pRight->p,(ulong)uVar3), iVar4 != 0)) {
    return iVar4;
  }
  return uVar1 - uVar2;
}

Assistant:

static int fts5BufferCompare(Fts5Buffer *pLeft, Fts5Buffer *pRight){
  int nCmp, res;
  nCmp = MIN(pLeft->n, pRight->n);
  assert( nCmp<=0 || pLeft->p!=0 );
  assert( nCmp<=0 || pRight->p!=0 );
  res = fts5Memcmp(pLeft->p, pRight->p, nCmp);
  return (res==0 ? (pLeft->n - pRight->n) : res);
}